

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

CEPlanet * __thiscall CEPlanet::operator=(CEPlanet *this,CEPlanet *other)

{
  if (this != other) {
    CEBody::operator=(&this->super_CEBody,&other->super_CEBody);
    free_members(this);
    init_members(this);
    copy_members(this,other);
  }
  return this;
}

Assistant:

CEPlanet& CEPlanet::operator=(const CEPlanet& other)
{
    if (this != &other) {
        // Copy parent class members
        this->CEBody::operator=(other);

        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}